

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

void __thiscall
QPDF::replaceReserved(QPDF *this,QPDFObjectHandle *reserved,QPDFObjectHandle *replacement)

{
  qpdf_object_type_e qVar1;
  QPDFObjGen og;
  logic_error *this_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  qVar1 = QPDFObjectHandle::getTypeCode(reserved);
  if (qVar1 - ot_reserved < 2) {
    og = QPDFObjectHandle::getObjGen(reserved);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)replacement);
    replaceObject(this,og,(QPDFObjectHandle *)&local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"replaceReserved called with non-reserved object");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void
QPDF::replaceReserved(QPDFObjectHandle reserved, QPDFObjectHandle replacement)
{
    QTC::TC("qpdf", "QPDF replaceReserved");
    auto tc = reserved.getTypeCode();
    if (!(tc == ::ot_reserved || tc == ::ot_null)) {
        throw std::logic_error("replaceReserved called with non-reserved object");
    }
    replaceObject(reserved.getObjGen(), replacement);
}